

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O1

void Qentem::StringUtils::EscapeHTMLSpecialChars<Qentem::StringStream<wchar_t>,wchar_t>
               (StringStream<wchar_t> *stream,wchar_t *str,SizeT length)

{
  wchar_t wVar1;
  long lVar2;
  wchar_t *pwVar3;
  wchar_t *to;
  uint uVar4;
  SizeT new_capacity;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  if (length != 0) {
    uVar7 = 0;
    do {
      iVar5 = (int)uVar7;
      wVar1 = str[uVar7];
      if (wVar1 < L'\'') {
        if (wVar1 == L'\"') {
          uVar4 = stream->length_ + (iVar5 - uVar6);
          if (stream->capacity_ < uVar4) {
            StringStream<wchar_t>::expand(stream,uVar4);
          }
          Memory::Copy<unsigned_int>
                    (stream->storage_ + stream->length_,str + uVar6,(iVar5 - uVar6) * 4);
          stream->length_ = uVar4;
          new_capacity = uVar4 + 6;
          if (stream->capacity_ < new_capacity) {
            StringStream<wchar_t>::expand(stream,new_capacity);
          }
          to = stream->storage_ + stream->length_;
          pwVar3 = L"&quot;";
          goto LAB_001214d4;
        }
        if (wVar1 == L'&') {
          uVar4 = length - iVar5;
          if ((uVar4 < 6) || (str[uVar7 + 5] != L';')) {
LAB_001214e6:
            if ((4 < uVar4) && (str[uVar7 + 4] == L';')) {
              pwVar3 = L"&amp;";
              lVar2 = 0;
              do {
                if (str[uVar7 + lVar2] != *pwVar3) goto LAB_00121513;
                lVar2 = lVar2 + 1;
                pwVar3 = pwVar3 + 1;
              } while (lVar2 != 4);
              lVar2 = 4;
LAB_00121513:
              if ((int)lVar2 == 4) {
                uVar7 = (ulong)(iVar5 + 5);
                goto LAB_001215f8;
              }
            }
            if ((uVar4 < 4) || (str[uVar7 + 3] != L';')) {
LAB_00121580:
              uVar4 = stream->length_ + (iVar5 - uVar6);
              if (stream->capacity_ < uVar4) {
                StringStream<wchar_t>::expand(stream,uVar4);
              }
              Memory::Copy<unsigned_int>
                        (stream->storage_ + stream->length_,str + uVar6,(iVar5 - uVar6) * 4);
              stream->length_ = uVar4;
              new_capacity = uVar4 + 5;
              if (stream->capacity_ < new_capacity) {
                StringStream<wchar_t>::expand(stream,new_capacity);
              }
              to = stream->storage_ + stream->length_;
              pwVar3 = L"&amp;";
              uVar6 = 0x14;
              goto LAB_001215e9;
            }
            pwVar3 = L"&lt;";
            lVar2 = 0;
            do {
              if (str[uVar7 + lVar2] != *pwVar3) goto LAB_0012154e;
              lVar2 = lVar2 + 1;
              pwVar3 = pwVar3 + 1;
            } while (lVar2 != 3);
            lVar2 = 3;
LAB_0012154e:
            if ((int)lVar2 != 3) {
              pwVar3 = L"&gt;";
              lVar2 = 0;
              do {
                if (str[uVar7 + lVar2] != *pwVar3) goto LAB_00121575;
                lVar2 = lVar2 + 1;
                pwVar3 = pwVar3 + 1;
              } while (lVar2 != 3);
              lVar2 = 3;
LAB_00121575:
              if ((int)lVar2 != 3) goto LAB_00121580;
            }
            uVar7 = (ulong)(iVar5 + 4);
          }
          else {
            pwVar3 = L"&quot;";
            lVar2 = 0;
            do {
              if (str[uVar7 + lVar2] != *pwVar3) goto LAB_00121360;
              lVar2 = lVar2 + 1;
              pwVar3 = pwVar3 + 1;
            } while (lVar2 != 5);
            lVar2 = 5;
LAB_00121360:
            if ((int)lVar2 != 5) {
              pwVar3 = L"&apos;";
              lVar2 = 0;
              do {
                if (str[uVar7 + lVar2] != *pwVar3) goto LAB_00121387;
                lVar2 = lVar2 + 1;
                pwVar3 = pwVar3 + 1;
              } while (lVar2 != 5);
              lVar2 = 5;
LAB_00121387:
              if ((int)lVar2 != 5) goto LAB_001214e6;
            }
            uVar7 = (ulong)(iVar5 + 6);
          }
        }
        else {
LAB_001214de:
          uVar7 = (ulong)(iVar5 + 1);
        }
      }
      else {
        if (wVar1 == L'\'') {
          uVar4 = stream->length_ + (iVar5 - uVar6);
          if (stream->capacity_ < uVar4) {
            StringStream<wchar_t>::expand(stream,uVar4);
          }
          Memory::Copy<unsigned_int>
                    (stream->storage_ + stream->length_,str + uVar6,(iVar5 - uVar6) * 4);
          stream->length_ = uVar4;
          new_capacity = uVar4 + 6;
          if (stream->capacity_ < new_capacity) {
            StringStream<wchar_t>::expand(stream,new_capacity);
          }
          to = stream->storage_ + stream->length_;
          pwVar3 = L"&apos;";
LAB_001214d4:
          uVar6 = 0x18;
        }
        else {
          if (wVar1 == L'<') {
            uVar4 = stream->length_ + (iVar5 - uVar6);
            if (stream->capacity_ < uVar4) {
              StringStream<wchar_t>::expand(stream,uVar4);
            }
            Memory::Copy<unsigned_int>
                      (stream->storage_ + stream->length_,str + uVar6,(iVar5 - uVar6) * 4);
            stream->length_ = uVar4;
            new_capacity = uVar4 + 4;
            if (stream->capacity_ < new_capacity) {
              StringStream<wchar_t>::expand(stream,new_capacity);
            }
            to = stream->storage_ + stream->length_;
            pwVar3 = L"&lt;";
          }
          else {
            if (wVar1 != L'>') goto LAB_001214de;
            uVar4 = stream->length_ + (iVar5 - uVar6);
            if (stream->capacity_ < uVar4) {
              StringStream<wchar_t>::expand(stream,uVar4);
            }
            Memory::Copy<unsigned_int>
                      (stream->storage_ + stream->length_,str + uVar6,(iVar5 - uVar6) * 4);
            stream->length_ = uVar4;
            new_capacity = uVar4 + 4;
            if (stream->capacity_ < new_capacity) {
              StringStream<wchar_t>::expand(stream,new_capacity);
            }
            to = stream->storage_ + stream->length_;
            pwVar3 = L"&gt;";
          }
          uVar6 = 0x10;
        }
LAB_001215e9:
        Memory::Copy<unsigned_int>(to,pwVar3,uVar6);
        stream->length_ = new_capacity;
        uVar6 = iVar5 + 1;
        uVar7 = (ulong)uVar6;
      }
LAB_001215f8:
    } while ((uint)uVar7 < length);
  }
  uVar4 = stream->length_ + (length - uVar6);
  if (stream->capacity_ < uVar4) {
    StringStream<wchar_t>::expand(stream,uVar4);
  }
  Memory::Copy<unsigned_int>(stream->storage_ + stream->length_,str + uVar6,(length - uVar6) * 4);
  stream->length_ = uVar4;
  return;
}

Assistant:

static void EscapeHTMLSpecialChars(StringStream_T &stream, const Char_T *str, SizeT length) {
    using HTMLSpecialChars = HTMLSpecialChars_T<Char_T, sizeof(Char_T)>;

    if (Config::AutoEscapeHTML) {
        SizeT offset = 0;
        SizeT index  = 0;

        while (index < length) {
            switch (str[index]) {
                case '&': {
                    const SizeT   rem_length = (length - index);
                    const Char_T *n_str      = (str + index);

                    if ((rem_length > SizeT{5}) && (n_str[SizeT{5}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLQuote, SizeT{5}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLSingleQuote, SizeT{5})) {
                            index += SizeT{6};
                            break;
                        }
                    }

                    if ((rem_length > SizeT{4}) && (n_str[SizeT{4}] == HTMLSpecialChars::SemicolonChar) &&
                        StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLAnd, SizeT{4})) {
                        index += SizeT{5};
                        break;
                    }

                    if ((rem_length > SizeT{3}) && (n_str[SizeT{3}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLLess, SizeT{3}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLGreater, SizeT{3})) {
                            index += SizeT{4};
                            break;
                        }
                    }

                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLAnd, HTMLSpecialChars::HTMLAndLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '<': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLLess, HTMLSpecialChars::HTMLLessLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '>': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLGreater, HTMLSpecialChars::HTMLGreaterLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '"': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLQuote, HTMLSpecialChars::HTMLQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '\'': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLSingleQuote, HTMLSpecialChars::HTMLSingleQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                default: {
                    ++index;
                }
            }
        }

        stream.Write((str + offset), (length - offset));
    } else {
        stream.Write(str, length);
    }
}